

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

QString * __thiscall
QHash<std::pair<QString,_QString>,_QString>::operator[]
          (QHash<std::pair<QString,_QString>,_QString> *this,pair<QString,_QString> *key)

{
  QString *pQVar1;
  long in_FS_OFFSET;
  pair<QString,_QString> *in_stack_ffffffffffffffb8;
  QHash<std::pair<QString,_QString>,_QString> local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  tryEmplace<>(local_20,in_stack_ffffffffffffffb8);
  pQVar1 = iterator::operator*((iterator *)0x2ff343);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        return *tryEmplace(key).iterator;
    }